

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O3

path * fsbridge::AbsPathJoin(path *__return_storage_ptr__,path *base,path *path)

{
  char cVar1;
  long in_FS_OFFSET;
  path local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = std::filesystem::__cxx11::path::has_root_directory();
  if (cVar1 == '\0') {
    __assert_fail("base.is_absolute()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/fs.cpp"
                  ,0x26,"fs::path fsbridge::AbsPathJoin(const fs::path &, const fs::path &)");
  }
  if ((path->super_path)._M_pathname._M_string_length == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,&base->super_path);
      return __return_storage_ptr__;
    }
  }
  else {
    std::filesystem::__cxx11::path::path(&local_50,&base->super_path);
    std::filesystem::__cxx11::path::operator/=(&local_50,&path->super_path);
    std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,&local_50);
    std::filesystem::__cxx11::path::~path(&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

fs::path AbsPathJoin(const fs::path& base, const fs::path& path)
{
    assert(base.is_absolute());
    return path.empty() ? base : fs::path(base / path);
}